

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

void lys_sub_module_remove_devs_augs(lys_module *module)

{
  lys_submodule *plVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < module->deviation_size; uVar4 = uVar4 + 1) {
    remove_dev((lys_deviation *)((long)&module->deviation->target_name + lVar3),module);
    lVar3 = lVar3 + 0x38;
  }
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < module->augment_size; uVar4 = uVar4 + 1) {
    remove_aug((lys_node_augment *)(module->augment->padding + lVar3 + -0x1c));
    lVar3 = lVar3 + 0x68;
  }
  bVar2 = 0;
  while( true ) {
    if (module->inc_size <= bVar2) {
      return;
    }
    plVar1 = module->inc[bVar2].submodule;
    if (plVar1 == (lys_submodule *)0x0) break;
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < plVar1->deviation_size; uVar4 = uVar4 + 1) {
      remove_dev((lys_deviation *)((long)&plVar1->deviation->target_name + lVar3),module);
      plVar1 = module->inc[bVar2].submodule;
      lVar3 = lVar3 + 0x38;
    }
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < plVar1->augment_size; uVar4 = uVar4 + 1) {
      remove_aug((lys_node_augment *)(plVar1->augment->padding + lVar3 + -0x1c));
      plVar1 = module->inc[bVar2].submodule;
      lVar3 = lVar3 + 0x68;
    }
    bVar2 = bVar2 + 1;
  }
  return;
}

Assistant:

void
lys_sub_module_remove_devs_augs(struct lys_module *module)
{
    uint8_t u, v;

    /* remove applied deviations */
    for (u = 0; u < module->deviation_size; ++u) {
        remove_dev(&module->deviation[u], module);
    }
    /* remove applied augments */
    for (u = 0; u < module->augment_size; ++u) {
        remove_aug(&module->augment[u]);
    }

    /* remove deviation and augments defined in submodules */
    for (v = 0; v < module->inc_size && module->inc[v].submodule; ++v) {
        for (u = 0; u < module->inc[v].submodule->deviation_size; ++u) {
            remove_dev(&module->inc[v].submodule->deviation[u], module);
        }

        for (u = 0; u < module->inc[v].submodule->augment_size; ++u) {
            remove_aug(&module->inc[v].submodule->augment[u]);
        }
    }
}